

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_> __thiscall
kj::
heap<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>,kj::Own<kj::Directory>>
          (kj *this,Own<kj::Directory> *params)

{
  BrokenReplacer<kj::Directory> *this_00;
  Own<kj::Directory> *other;
  BrokenReplacer<kj::Directory> *extraout_RDX;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_> OVar1;
  Own<const_kj::Directory> local_28;
  NoInfer<kj::Own<kj::Directory>_> *local_18;
  Own<kj::Directory> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::Directory> *)this;
  this_00 = (BrokenReplacer<kj::Directory> *)operator_new(0x20);
  other = fwd<kj::Own<kj::Directory>>(local_18);
  Own<const_kj::Directory>::Own(&local_28,other);
  anon_unknown_35::InMemoryDirectory::BrokenReplacer<kj::Directory>::BrokenReplacer
            (this_00,&local_28);
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_>::Own
            ((Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_> *)
             this,this_00,
             (Disposer *)
             &_::
              HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>>
              ::instance);
  Own<const_kj::Directory>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}